

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prototype_factory.cpp
# Opt level: O1

void __thiscall Contact::Contact(Contact *this,Contact *other)

{
  pointer pcVar1;
  Address *pAVar2;
  long lVar3;
  _Alloc_hider _Var4;
  Address *pAVar5;
  
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  pcVar1 = (other->name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar1,pcVar1 + (other->name)._M_string_length);
  pAVar2 = (other->work_address)._M_t.super___uniq_ptr_impl<Address,_std::default_delete<Address>_>.
           _M_t.super__Tuple_impl<0UL,_Address_*,_std::default_delete<Address>_>.
           super__Head_base<0UL,_Address_*,_false>._M_head_impl;
  if (pAVar2 == (Address *)0x0) {
    (this->work_address)._M_t.super___uniq_ptr_impl<Address,_std::default_delete<Address>_>._M_t.
    super__Tuple_impl<0UL,_Address_*,_std::default_delete<Address>_>.
    super__Head_base<0UL,_Address_*,_false>._M_head_impl = (Address *)0x0;
    pAVar5 = (Address *)0x0;
  }
  else {
    pAVar5 = (Address *)operator_new(0x48);
    (pAVar5->street_address)._M_dataplus._M_p = (pointer)&(pAVar5->street_address).field_2;
    lVar3 = *(long *)&(pAVar2->street_address)._M_dataplus;
    std::__cxx11::string::_M_construct<char*>
              ((string *)pAVar5,lVar3,(pAVar2->street_address)._M_string_length + lVar3);
    (pAVar5->city)._M_dataplus._M_p = (pointer)&(pAVar5->city).field_2;
    _Var4._M_p = (pAVar2->city)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pAVar5->city,_Var4._M_p,_Var4._M_p + (pAVar2->city)._M_string_length);
    pAVar5->suite = pAVar2->suite;
  }
  (this->work_address)._M_t.super___uniq_ptr_impl<Address,_std::default_delete<Address>_>._M_t.
  super__Tuple_impl<0UL,_Address_*,_std::default_delete<Address>_>.
  super__Head_base<0UL,_Address_*,_false>._M_head_impl = pAVar5;
  return;
}

Assistant:

Contact(const Contact& other)
		:	name{other.name},
			work_address{other.work_address ? std::make_unique<Address>(*other.work_address) : nullptr}
		{}